

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void dc_store_32xh(uint16_t *dst,ptrdiff_t stride,int height,__m128i *dc)

{
  undefined1 auVar1 [16];
  int local_ec;
  undefined8 local_d8;
  uint16_t *local_b0;
  int i;
  __m128i dc_dup;
  __m128i dc_dup_lo;
  __m128i *dc_local;
  int height_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  auVar1 = pshuflw((undefined1  [16])*dc,(undefined1  [16])*dc,0);
  local_d8 = auVar1._0_8_;
  local_b0 = dst;
  for (local_ec = 0; local_ec < height; local_ec = local_ec + 1) {
    *(undefined8 *)local_b0 = local_d8;
    *(undefined8 *)(local_b0 + 4) = local_d8;
    *(undefined8 *)(local_b0 + 8) = local_d8;
    *(undefined8 *)(local_b0 + 0xc) = local_d8;
    *(undefined8 *)(local_b0 + 0x10) = local_d8;
    *(undefined8 *)(local_b0 + 0x14) = local_d8;
    *(undefined8 *)(local_b0 + 0x18) = local_d8;
    *(undefined8 *)(local_b0 + 0x1c) = local_d8;
    local_b0 = local_b0 + stride;
  }
  return;
}

Assistant:

static inline void dc_store_32xh(uint16_t *dst, ptrdiff_t stride, int height,
                                 const __m128i *dc) {
  const __m128i dc_dup_lo = _mm_shufflelo_epi16(*dc, 0);
  const __m128i dc_dup = _mm_unpacklo_epi64(dc_dup_lo, dc_dup_lo);
  int i;
  for (i = 0; i < height; ++i, dst += stride) {
    _mm_store_si128((__m128i *)dst, dc_dup);
    _mm_store_si128((__m128i *)(dst + 8), dc_dup);
    _mm_store_si128((__m128i *)(dst + 16), dc_dup);
    _mm_store_si128((__m128i *)(dst + 24), dc_dup);
  }
}